

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

bool __thiscall ftxui::MenuBase::OnEvent(MenuBase *this,Event *event)

{
  int iVar1;
  pointer pcVar2;
  ComponentBase *pCVar3;
  MenuOption *pMVar4;
  Ref<int> *pRVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  int iVar9;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar10;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar11;
  Ref<int> *pRVar12;
  MenuOption *pMVar13;
  pointer *__ptr;
  int *piVar14;
  ulong uVar15;
  Event local_a8;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  ScreenInteractive *local_30;
  
  ComponentBase::CaptureMouse((ComponentBase *)&local_a8,(Event *)this);
  if ((_func_int **)local_a8._0_8_ == (_func_int **)0x0) {
    return false;
  }
  (**(code **)(*(_func_int **)local_a8._0_8_ + 8))();
  if (event->type_ == Mouse) {
    local_68._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
    local_68._0_4_ = event->type_;
    local_68._4_4_ = (event->field_1).mouse_.button;
    local_68._8_4_ = (event->field_1).mouse_.motion;
    local_68._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
    pcVar2 = (event->input_)._M_dataplus._M_p;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (event->input_)._M_string_length);
    local_30 = event->screen_;
    bVar7 = OnMouseEvent(this,(Event *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p == &local_40) {
      return bVar7;
    }
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    return bVar7;
  }
  bVar7 = ComponentBase::Focused(&this->super_ComponentBase);
  if (!bVar7) {
    return false;
  }
  iVar1 = *this->selected_;
  bVar7 = Event::operator==(event,(Event *)Event::ArrowUp);
  if (bVar7) {
LAB_0013fd24:
    *this->selected_ = *this->selected_ + -1;
  }
  else {
    Event::Character(&local_a8,'k');
    _Var6._M_p = local_a8.input_._M_dataplus._M_p;
    pCVar3 = (ComponentBase *)(event->input_)._M_string_length;
    if (pCVar3 == (ComponentBase *)local_a8.input_._M_string_length) {
      if (pCVar3 == (ComponentBase *)0x0) {
        bVar7 = true;
      }
      else {
        iVar8 = bcmp((event->input_)._M_dataplus._M_p,local_a8.input_._M_dataplus._M_p,
                     (size_t)pCVar3);
        bVar7 = iVar8 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (_Var6._M_p != (pointer)((long)&local_a8 + 0x28U)) {
      operator_delete(_Var6._M_p,local_a8.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) goto LAB_0013fd24;
  }
  bVar7 = Event::operator==(event,(Event *)Event::ArrowDown);
  if (bVar7) {
LAB_0013fda1:
    *this->selected_ = *this->selected_ + 1;
  }
  else {
    Event::Character(&local_a8,'j');
    pCVar3 = (ComponentBase *)(event->input_)._M_string_length;
    if (pCVar3 == (ComponentBase *)local_a8.input_._M_string_length) {
      if (pCVar3 == (ComponentBase *)0x0) {
        bVar7 = true;
      }
      else {
        iVar8 = bcmp((event->input_)._M_dataplus._M_p,local_a8.input_._M_dataplus._M_p,
                     (size_t)pCVar3);
        bVar7 = iVar8 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (local_a8.input_._M_dataplus._M_p != (pointer)((long)&local_a8 + 0x28U)) {
      operator_delete(local_a8.input_._M_dataplus._M_p,
                      local_a8.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) goto LAB_0013fda1;
  }
  bVar7 = Event::operator==(event,(Event *)Event::Tab);
  if (bVar7) {
    pvVar10 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)(this->entries_).ref_;
    if (pvVar10 ==
        (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      pvVar10 = (this->entries_).ref_wide_;
    }
    if ((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10 != 0) {
      *this->selected_ =
           (int)(((long)*this->selected_ + 1U) %
                (ulong)((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10 >> 5));
    }
  }
  bVar7 = Event::operator==(event,(Event *)Event::TabReverse);
  pvVar10 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)(this->entries_).ref_;
  if (bVar7) {
    pvVar11 = pvVar10;
    if (pvVar10 ==
        (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      pvVar11 = (this->entries_).ref_wide_;
    }
    piVar14 = this->selected_;
    if ((long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 != 0) {
      uVar15 = (long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 >> 5;
      *piVar14 = (int)((((long)*piVar14 + uVar15) - 1) % uVar15);
    }
  }
  else {
    piVar14 = this->selected_;
  }
  if (pvVar10 ==
      (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       *)0x0) {
    pvVar10 = (this->entries_).ref_wide_;
  }
  iVar8 = (int)((ulong)((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10) >> 5) + -1;
  if (*piVar14 < iVar8) {
    iVar8 = *piVar14;
  }
  iVar9 = 0;
  if (0 < iVar8) {
    iVar9 = iVar8;
  }
  *piVar14 = iVar9;
  if (iVar9 == iVar1) {
    bVar7 = Event::operator==(event,(Event *)Event::Return);
    if (!bVar7) {
      return false;
    }
    pMVar4 = (this->option_).address_;
    pMVar13 = &(this->option_).owned_;
    if (pMVar4 != (MenuOption *)0x0) {
      pMVar13 = pMVar4;
    }
    if ((pMVar13->on_enter).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0013feef:
      std::__throw_bad_function_call();
    }
    (*(pMVar13->on_enter)._M_invoker)((_Any_data *)&pMVar13->on_enter);
  }
  else {
    pMVar4 = (this->option_).address_;
    pMVar13 = &(this->option_).owned_;
    if (pMVar4 != (MenuOption *)0x0) {
      pMVar13 = pMVar4;
    }
    pRVar5 = (Ref<int> *)(pMVar13->focused_entry).address_;
    pRVar12 = &pMVar13->focused_entry;
    if (pRVar5 != (Ref<int> *)0x0) {
      pRVar12 = pRVar5;
    }
    pRVar12->owned_ = iVar9;
    if ((pMVar13->on_change).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_0013feef;
    (*(pMVar13->on_change)._M_invoker)((_Any_data *)&pMVar13->on_change);
  }
  return true;
}

Assistant:

bool OnEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (!Focused())
      return false;

    int old_selected = *selected_;
    if (event == Event::ArrowUp || event == Event::Character('k'))
      (*selected_)--;
    if (event == Event::ArrowDown || event == Event::Character('j'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (*selected_ != old_selected) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }